

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  undefined4 *puVar1;
  Curl_cfilter *pCVar2;
  void *pvVar3;
  byte bVar4;
  CURLcode CVar5;
  timediff_t tVar6;
  CURLcode *pCVar7;
  ulong uVar8;
  char *fmt;
  CURLcode CVar9;
  Curl_cfilter *pCVar10;
  cf_hc_baller *winner;
  curltime older;
  curltime cVar11;
  curltime newer;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  puVar1 = (undefined4 *)cf->ctx;
  *done = false;
  cVar11 = Curl_now();
  CVar9 = CURLE_OK;
  CVar5 = CURLE_OK;
  switch(*puVar1) {
  case 0:
    break;
  case 1:
    goto switchD_00613fd2_caseD_1;
  case 2:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar5 = CVar9;
    goto switchD_00613fd2_default;
  case 3:
    CVar9 = puVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    goto LAB_00614283;
  default:
    goto switchD_00613fd2_default;
  }
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect, init");
  }
  *(time_t *)(puVar1 + 4) = cVar11.tv_sec;
  puVar1[6] = cVar11.tv_usec;
  if (*(char *)(puVar1 + 0x15) == '\x01') {
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 10),cf,data,"h3",5);
    if (*(char *)(puVar1 + 0x21) == '\x01') {
      Curl_expire(data,(long)(int)puVar1[0x22],EXPIRE_ALPN_EYEBALLS);
    }
  }
  else if (*(char *)(puVar1 + 0x21) == '\x01') {
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
  }
  *puVar1 = 1;
switchD_00613fd2_caseD_1:
  if (((*(char *)(puVar1 + 0x15) == '\x01') &&
      (pCVar10 = *(Curl_cfilter **)(puVar1 + 0xc), pCVar10 != (Curl_cfilter *)0x0)) &&
     (puVar1[0xe] == 0)) {
    pCVar2 = cf->next;
    cf->next = pCVar10;
    CVar5 = Curl_conn_cf_connect(pCVar10,data,false,done);
    puVar1[0xe] = CVar5;
    *(Curl_cfilter **)(puVar1 + 0xc) = cf->next;
    cf->next = pCVar2;
    if ((CVar5 != CURLE_OK) || (*done != true)) goto LAB_0061411f;
    winner = (cf_hc_baller *)(puVar1 + 10);
LAB_006141fb:
    CVar5 = baller_connected(cf,data,winner);
  }
  else {
LAB_0061411f:
    pvVar3 = cf->ctx;
    if ((*(char *)((long)pvVar3 + 0x84) == '\x01') && (*(long *)((long)pvVar3 + 0x60) == 0)) {
      if (((*(char *)((long)pvVar3 + 0x54) == '\x01') && (*(long *)((long)pvVar3 + 0x30) != 0)) &&
         (*(int *)((long)pvVar3 + 0x38) == 0)) {
        older._12_4_ = 0;
        older._0_12_ = *(undefined1 (*) [12])((long)pvVar3 + 0x10);
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar11._0_12_,0);
        newer.tv_usec = SUB124(cVar11._0_12_,8);
        tVar6 = Curl_timediff(newer,older);
        uVar8 = (ulong)*(int *)((long)pvVar3 + 0x8c);
        if (tVar6 < (long)uVar8) {
          if (*(int *)((long)pvVar3 + 0x88) <= tVar6) {
            if (*(int *)((long)pvVar3 + 0x50) < 0) {
              (**(code **)(**(long **)((long)pvVar3 + 0x30) + 0x68))
                        (*(long **)((long)pvVar3 + 0x30),data,2,(long)pvVar3 + 0x50,0);
              if (*(int *)((long)pvVar3 + 0x50) < 0) {
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
                   (0 < cf->cft->log_level)) {
                  uVar8 = (ulong)*(uint *)((long)pvVar3 + 0x88);
                  fmt = "soft timeout of %dms reached, h3 has not seen any data, starting h21";
                  goto LAB_00614377;
                }
                goto LAB_0061414d;
              }
              uVar8 = (ulong)*(int *)((long)pvVar3 + 0x8c);
            }
            Curl_expire(data,uVar8 - tVar6,EXPIRE_ALPN_EYEBALLS);
          }
          goto LAB_00614170;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          fmt = "hard timeout of %dms reached, starting h21";
LAB_00614377:
          Curl_trc_cf_infof(data,cf,fmt,uVar8);
        }
      }
LAB_0061414d:
      cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
    }
LAB_00614170:
    if (((*(char *)(puVar1 + 0x21) == '\x01') &&
        (pCVar10 = *(Curl_cfilter **)(puVar1 + 0x18), pCVar10 != (Curl_cfilter *)0x0)) &&
       (puVar1[0x1a] == 0)) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"connect, check h21");
        pCVar10 = *(Curl_cfilter **)(puVar1 + 0x18);
      }
      pCVar2 = cf->next;
      cf->next = pCVar10;
      CVar5 = Curl_conn_cf_connect(pCVar10,data,false,done);
      puVar1[0x1a] = CVar5;
      *(Curl_cfilter **)(puVar1 + 0x18) = cf->next;
      cf->next = pCVar2;
      if ((CVar5 == CURLE_OK) && (*done == true)) {
        winner = (cf_hc_baller *)(puVar1 + 0x16);
        goto LAB_006141fb;
      }
    }
    bVar4 = *(byte *)(puVar1 + 0x15);
    if (((bVar4 == 1) && (puVar1[0xe] == 0)) ||
       ((*(char *)(puVar1 + 0x21) == '\x01' && (puVar1[0x1a] == 0)))) {
LAB_00614283:
      *done = false;
      CVar5 = CVar9;
    }
    else {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"connect, all failed");
        bVar4 = *(byte *)(puVar1 + 0x15);
      }
      pCVar7 = puVar1 + 0x1a;
      if ((bVar4 & 1) != 0) {
        pCVar7 = puVar1 + 0xe;
      }
      CVar5 = *pCVar7;
      puVar1[8] = CVar5;
      *puVar1 = 3;
    }
  }
switchD_00613fd2_default:
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar5,(ulong)*done);
  }
  return CVar5;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!ctx->h3_baller.cf);
    DEBUGASSERT(!ctx->h21_baller.cf);
    DEBUGASSERT(!cf->next);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    if(ctx->h3_baller.enabled) {
      cf_hc_baller_init(&ctx->h3_baller, cf, data, "h3", TRNSPRT_QUIC);
      if(ctx->h21_baller.enabled)
        Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
    }
    else if(ctx->h21_baller.enabled)
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                       cf->conn->transport);
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->h3_baller)) {
      result = cf_hc_baller_connect(&ctx->h3_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h3_baller);
        goto out;
      }
    }

    if(time_to_start_h21(cf, data, now)) {
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                        cf->conn->transport);
    }

    if(cf_hc_baller_is_active(&ctx->h21_baller)) {
      CURL_TRC_CF(data, cf, "connect, check h21");
      result = cf_hc_baller_connect(&ctx->h21_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h21_baller);
        goto out;
      }
    }

    if((!ctx->h3_baller.enabled || ctx->h3_baller.result) &&
       (!ctx->h21_baller.enabled || ctx->h21_baller.result)) {
      /* both failed or disabled. we give up */
      CURL_TRC_CF(data, cf, "connect, all failed");
      result = ctx->result = ctx->h3_baller.enabled?
                              ctx->h3_baller.result : ctx->h21_baller.result;
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}